

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O0

void __thiscall
Nova::Boundary_Uniform<float,_1>::Fill_Ghost_Cells
          (Boundary_Uniform<float,_1> *this,T_Grid *grid,T_Arrays *u,T_Arrays *u_ghost,float dt,
          float time,int number_of_ghost_cells)

{
  float fVar1;
  bool bVar2;
  float *pfVar3;
  Range<int,_1> *pRVar4;
  uint local_a0;
  int side;
  undefined1 local_90 [8];
  Array<Nova::Range<int,_1>_> regions;
  T_Index *index;
  undefined1 local_68 [8];
  Cell_Iterator iterator;
  int number_of_ghost_cells_local;
  float time_local;
  float dt_local;
  T_Arrays *u_ghost_local;
  T_Arrays *u_local;
  T_Grid *grid_local;
  Boundary_Uniform<float,_1> *this_local;
  
  index._4_4_ = 0;
  iterator.super_Grid_Iterator<float,_1>._44_4_ = number_of_ghost_cells;
  Grid_Iterator_Cell<float,_1>::Grid_Iterator_Cell
            ((Grid_Iterator_Cell<float,_1> *)local_68,grid,0,(T_Region *)((long)&index + 4),0);
  while( true ) {
    bVar2 = Grid_Iterator<float,_1>::Valid((Grid_Iterator<float,_1> *)local_68);
    if (!bVar2) break;
    regions._data.super__Vector_base<Nova::Range<int,_1>,_std::allocator<Nova::Range<int,_1>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)Grid_Iterator_Cell<float,_1>::Cell_Index((Grid_Iterator_Cell<float,_1> *)local_68)
    ;
    pfVar3 = Array_ND<float,_1>::operator()
                       (u,(Vector<int,_1,_true> *)
                          regions._data.
                          super__Vector_base<Nova::Range<int,_1>,_std::allocator<Nova::Range<int,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
    fVar1 = *pfVar3;
    pfVar3 = Array_ND<float,_1>::operator()
                       (u_ghost,&(regions._data.
                                  super__Vector_base<Nova::Range<int,_1>,_std::allocator<Nova::Range<int,_1>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->min_corner);
    *pfVar3 = fVar1;
    Grid_Iterator<float,_1>::Next((Grid_Iterator<float,_1> *)local_68);
  }
  Array<Nova::Range<int,_1>_>::Array((Array<Nova::Range<int,_1>_> *)local_90);
  Find_Ghost_Regions(this,grid,(Array<Nova::Range<int,_1>_> *)local_90,
                     iterator.super_Grid_Iterator<float,_1>._44_4_);
  for (local_a0 = 0; (int)local_a0 < 2; local_a0 = local_a0 + 1) {
    pRVar4 = Array<Nova::Range<int,_1>_>::operator()
                       ((Array<Nova::Range<int,_1>_> *)local_90,local_a0);
    (*(this->super_Boundary<float,_1>)._vptr_Boundary[8])
              (dt,time,this,grid,u_ghost,(ulong)local_a0,pRVar4);
  }
  Array<Nova::Range<int,_1>_>::~Array((Array<Nova::Range<int,_1>_> *)local_90);
  return;
}

Assistant:

void Boundary_Uniform<T,d>::
Fill_Ghost_Cells(const T_Grid& grid,const T_Arrays& u,T_Arrays& u_ghost,const T dt,const T time,const int number_of_ghost_cells)
{
    using Cell_Iterator         = Grid_Iterator_Cell<T,d>;

    for(Cell_Iterator iterator(grid);iterator.Valid();iterator.Next()){const T_Index& index=iterator.Cell_Index();
        u_ghost(index)=u(index);}
    Array<Range<int,d> > regions;
    Find_Ghost_Regions(grid,regions,number_of_ghost_cells);
    for(int side=0;side<T_Grid::number_of_faces_per_cell;++side) Fill_Single_Ghost_Region(grid,u_ghost,side,dt,time,regions(side));
}